

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

int Gia_FormStrCount(char *pStr,int *pnVars,int *pnPars)

{
  int iVar1;
  size_t sVar2;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  int *pnPars_local;
  int *pnVars_local;
  char *pStr_local;
  
  local_30 = 0;
  if (*pStr == '(') {
    sVar2 = strlen(pStr);
    if (pStr[sVar2 - 1] == ')') {
      for (local_2c = 0; pStr[local_2c] != '\0'; local_2c = local_2c + 1) {
        if (pStr[local_2c] == '(') {
          local_30 = local_30 + 1;
        }
        else if (pStr[local_2c] == ')') {
          local_30 = local_30 + -1;
        }
      }
      if (local_30 == 0) {
        *pnVars = 0;
        *pnPars = 0;
        for (local_2c = 0; pStr[local_2c] != '\0'; local_2c = local_2c + 1) {
          if ((pStr[local_2c] < 'a') || ('b' < pStr[local_2c])) {
            if ((pStr[local_2c] < 'p') || ('s' < pStr[local_2c])) {
              if ((((((pStr[local_2c] != '(') && (pStr[local_2c] != ')')) && (pStr[local_2c] != '&')
                    ) && ((pStr[local_2c] != '|' && (pStr[local_2c] != '^')))) &&
                  (pStr[local_2c] != '?')) && (pStr[local_2c] != ':')) {
                if (pStr[local_2c] != '~') {
                  printf("Unknown symbol (%c) in the formula (%s)\n",
                         (ulong)(uint)(int)pStr[local_2c],pStr);
                  return 1;
                }
                if ((pStr[local_2c + 1] < 'a') || ('z' < pStr[local_2c + 1])) {
                  printf("Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n",
                         (ulong)(uint)(int)pStr[local_2c + 1]);
                  return 1;
                }
              }
            }
            else {
              iVar1 = Abc_MaxInt(*pnPars,pStr[local_2c] + -0x6f);
              *pnPars = iVar1;
            }
          }
          else {
            iVar1 = Abc_MaxInt(*pnVars,pStr[local_2c] + -0x60);
            *pnVars = iVar1;
          }
        }
        if (*pnVars == 2) {
          if ((*pnPars < 1) || (8 < *pnPars)) {
            printf("The number of parameters should be between 1 and %d\n",8);
            pStr_local._4_4_ = 1;
          }
          else {
            pStr_local._4_4_ = 0;
          }
        }
        else {
          printf("The number of input variables (%d) should be 2\n",(ulong)(uint)*pnVars);
          pStr_local._4_4_ = 1;
        }
      }
      else {
        printf("The number of opening and closing parentheses is not equal.\n");
        pStr_local._4_4_ = 1;
      }
    }
    else {
      printf("The last symbol should be the closing parenthesis \")\".\n");
      pStr_local._4_4_ = 1;
    }
  }
  else {
    printf("The first symbol should be the opening parenthesis \"(\".\n");
    pStr_local._4_4_ = 1;
  }
  return pStr_local._4_4_;
}

Assistant:

int Gia_FormStrCount( char * pStr, int * pnVars, int * pnPars )
{
    int i, Counter = 0;
    if ( pStr[0] != '(' )
    {
        printf( "The first symbol should be the opening parenthesis \"(\".\n" );
        return 1;
    }
    if ( pStr[strlen(pStr)-1] != ')' )
    {
        printf( "The last symbol should be the closing parenthesis \")\".\n" );
        return 1;
    }
    for ( i = 0; pStr[i]; i++ )
        if (  pStr[i] == '(' )
            Counter++;
        else if (  pStr[i] == ')' )
            Counter--;
    if ( Counter != 0 )
    {
        printf( "The number of opening and closing parentheses is not equal.\n" );
        return 1;
    }
    *pnVars = 0;
    *pnPars = 0;
    for ( i = 0; pStr[i]; i++ )
    {
        if ( pStr[i] >= 'a' && pStr[i] <= 'b' )
            *pnVars = Abc_MaxInt( *pnVars, pStr[i] - 'a' + 1 );
        else if ( pStr[i] >= 'p' && pStr[i] <= 's' )
            *pnPars = Abc_MaxInt( *pnPars, pStr[i] - 'p' + 1 );
        else if ( pStr[i] == '(' || pStr[i] == ')' )
        {}
        else if ( pStr[i] == '&' || pStr[i] == '|' || pStr[i] == '^' )
        {}
        else if ( pStr[i] == '?' || pStr[i] == ':' )
        {}
        else if ( pStr[i] == '~' )
        {
            if ( pStr[i+1] < 'a' || pStr[i+1] > 'z' )
            {
                printf( "Expecting alphabetic symbol (instead of \"%c\") after negation (~)\n",  pStr[i+1] );
                return 1;
            }
        }
        else 
        {
            printf( "Unknown symbol (%c) in the formula (%s)\n", pStr[i], pStr );
            return 1;
        }
    }
    if ( *pnVars != FFTEST_MAX_VARS )
        { printf( "The number of input variables (%d) should be 2\n", *pnVars ); return 1; }
    if ( *pnPars < 1 || *pnPars > FFTEST_MAX_PARS )
        { printf( "The number of parameters should be between 1 and %d\n", FFTEST_MAX_PARS ); return 1; }
    return 0;
}